

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ostream *poVar2;
  TestPartResult *pTVar3;
  int line;
  char *str;
  char *str_00;
  char *str_01;
  TimeInMillis ms;
  char *str_02;
  TestResult *result;
  char *str_03;
  int iVar4;
  XmlUnitTestResultPrinter *pXVar5;
  char *pcVar6;
  internal *this;
  int i;
  string location;
  string summary;
  string detail;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar2 = std::operator<<(stream,"    <testcase name=\"");
  EscapeXmlAttribute_abi_cxx11_
            (&location,(XmlUnitTestResultPrinter *)(test_info->name_)._M_dataplus._M_p,str);
  poVar2 = std::operator<<(poVar2,location._M_dataplus._M_p);
  std::operator<<(poVar2,"\"");
  std::__cxx11::string::~string((string *)&location);
  pbVar1 = (test_info->value_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    poVar2 = std::operator<<(stream," value_param=\"");
    pbVar1 = (test_info->value_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pXVar5 = (XmlUnitTestResultPrinter *)0x0;
    }
    else {
      pXVar5 = (XmlUnitTestResultPrinter *)(pbVar1->_M_dataplus)._M_p;
    }
    EscapeXmlAttribute_abi_cxx11_(&location,pXVar5,str_00);
    poVar2 = std::operator<<(poVar2,(string *)&location);
    std::operator<<(poVar2,"\"");
    std::__cxx11::string::~string((string *)&location);
  }
  pbVar1 = (test_info->type_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    poVar2 = std::operator<<(stream," type_param=\"");
    pbVar1 = (test_info->type_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pXVar5 = (XmlUnitTestResultPrinter *)0x0;
    }
    else {
      pXVar5 = (XmlUnitTestResultPrinter *)(pbVar1->_M_dataplus)._M_p;
    }
    EscapeXmlAttribute_abi_cxx11_(&location,pXVar5,str_01);
    poVar2 = std::operator<<(poVar2,(string *)&location);
    std::operator<<(poVar2,"\"");
    std::__cxx11::string::~string((string *)&location);
  }
  poVar2 = std::operator<<(stream," status=\"");
  pcVar6 = "notrun";
  if (test_info->should_run_ != false) {
    pcVar6 = "run";
  }
  poVar2 = std::operator<<(poVar2,pcVar6);
  poVar2 = std::operator<<(poVar2,"\" time=\"");
  FormatTimeInMillisAsSeconds_abi_cxx11_
            (&location,(internal *)(test_info->result_).elapsed_time_,ms);
  poVar2 = std::operator<<(poVar2,(string *)&location);
  poVar2 = std::operator<<(poVar2,"\" classname=\"");
  EscapeXmlAttribute_abi_cxx11_(&summary,(XmlUnitTestResultPrinter *)test_case_name,str_02);
  poVar2 = std::operator<<(poVar2,summary._M_dataplus._M_p);
  poVar2 = std::operator<<(poVar2,"\"");
  TestPropertiesAsXmlAttributes_abi_cxx11_
            (&detail,(XmlUnitTestResultPrinter *)&test_info->result_,result);
  std::operator<<(poVar2,detail._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&detail);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  iVar4 = 0;
  for (i = 0; line = 0x70,
      i < (int)(((long)(test_info->result_).test_part_results_.
                       super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(test_info->result_).test_part_results_.
                      super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x70); i = i + 1) {
    pTVar3 = TestResult::GetTestPartResult(&test_info->result_,i);
    if (pTVar3->type_ != kSuccess) {
      if (iVar4 == 0) {
        std::operator<<(stream,">\n");
      }
      this = (internal *)(pTVar3->file_name_)._M_string_length;
      if (this != (internal *)0x0) {
        this = (internal *)(pTVar3->file_name_)._M_dataplus._M_p;
      }
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (&location,this,(char *)(ulong)(uint)pTVar3->line_number_,line);
      std::operator+(&detail,&location,"\n");
      std::operator+(&summary,&detail,(pTVar3->summary_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&detail);
      poVar2 = std::operator<<(stream,"      <failure message=\"");
      EscapeXmlAttribute_abi_cxx11_
                (&detail,(XmlUnitTestResultPrinter *)summary._M_dataplus._M_p,str_03);
      poVar2 = std::operator<<(poVar2,(string *)&detail);
      std::operator<<(poVar2,"\" type=\"\">");
      std::__cxx11::string::~string((string *)&detail);
      std::operator+(&local_50,&location,"\n");
      std::operator+(&detail,&local_50,(pTVar3->message_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      RemoveInvalidXmlCharacters(&local_50,&detail);
      OutputXmlCDataSection(stream,local_50._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator<<(stream,"</failure>\n");
      iVar4 = iVar4 + 1;
      std::__cxx11::string::~string((string *)&detail);
      std::__cxx11::string::~string((string *)&summary);
      std::__cxx11::string::~string((string *)&location);
    }
  }
  pcVar6 = "    </testcase>\n";
  if (iVar4 == 0) {
    pcVar6 = " />\n";
  }
  std::operator<<(stream,pcVar6);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  *stream << "    <testcase name=\""
          << EscapeXmlAttribute(test_info.name()).c_str() << "\"";

  if (test_info.value_param() != NULL) {
    *stream << " value_param=\"" << EscapeXmlAttribute(test_info.value_param())
            << "\"";
  }
  if (test_info.type_param() != NULL) {
    *stream << " type_param=\"" << EscapeXmlAttribute(test_info.type_param())
            << "\"";
  }

  *stream << " status=\""
          << (test_info.should_run() ? "run" : "notrun")
          << "\" time=\""
          << FormatTimeInMillisAsSeconds(result.elapsed_time())
          << "\" classname=\"" << EscapeXmlAttribute(test_case_name).c_str()
          << "\"" << TestPropertiesAsXmlAttributes(result).c_str();

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const string location = internal::FormatCompilerIndependentFileLocation(
          part.file_name(), part.line_number());
      const string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}